

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O3

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpointer::
safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (jsonpointer *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value
          )

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_t n_00;
  void *pvVar4;
  iterator value_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  byte bVar6;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *item;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  _Var7;
  long lVar8;
  value_type *args;
  bool bVar9;
  type tVar10;
  array_range_type aVar11;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar12;
  size_t n;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_90;
  object_range_type local_78;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_58;
  string_view_type local_50;
  jsonpointer local_40 [16];
  
  bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(value);
  if ((!bVar3) ||
     (bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(value), bVar3)
     ) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,value);
    uVar5 = extraout_RDX;
  }
  else {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_78,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value);
    bVar2 = local_78.last_.has_value_;
    bVar1 = local_78.first_.has_value_;
    bVar6 = local_78.first_.has_value_ & local_78.last_.has_value_;
    local_58 = local_78.last_.it_._M_current;
    bVar9 = local_78.first_.it_._M_current == local_78.last_.it_._M_current;
    bVar3 = local_78.first_.has_value_ == local_78.last_.has_value_;
    if ((bVar6 & 1) != 0) {
      bVar3 = bVar9;
    }
    if (!bVar3) {
      lVar8 = -1;
      _Var7._M_current = local_78.first_.it_._M_current;
      do {
        tVar10 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                           (*(detail **)&(_Var7._M_current)->key_,
                            (char *)(((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                                       *)&(_Var7._M_current)->key_)->long_str_).ptr_,
                            (size_t)&local_90,(unsigned_long *)(ulong)bVar9);
        if ((tVar10.ec != success) ||
           (lVar8 = lVar8 + 1, lVar8 != CONCAT62(local_90._2_6_,local_90.common_))) {
          pvVar4 = operator_new(0x20);
          *(undefined8 *)((long)pvVar4 + 8) = 0;
          *(undefined8 *)((long)pvVar4 + 0x10) = 0;
          *(undefined8 *)((long)pvVar4 + 0x18) = 0;
          *(undefined2 *)this = 0xd;
          *(void **)(this + 8) = pvVar4;
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                    (&local_78,
                     (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value);
          bVar3 = local_78.first_.has_value_ == local_78.last_.has_value_;
          if ((local_78.first_.has_value_ & local_78.last_.has_value_ & 1U) != 0) {
            bVar3 = local_78.first_.it_._M_current == local_78.last_.it_._M_current;
          }
          uVar5 = extraout_RDX_01;
          if (!bVar3) {
            _Var7._M_current = local_78.first_.it_._M_current;
            do {
              local_50._M_str = *(char **)&(_Var7._M_current)->key_;
              local_50._M_len =
                   (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                      *)&(_Var7._M_current)->key_)->int64_).val_;
              safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                        (local_40,&(_Var7._M_current)->value_);
              basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                        ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                          *)&local_90.common_,
                         (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,
                         &local_50,
                         (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         local_40);
              basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         local_40);
              _Var7._M_current = _Var7._M_current + 1;
              bVar3 = _Var7._M_current == local_78.last_.it_._M_current;
              if ((local_78.first_.has_value_ & local_78.last_.has_value_ & 1U) == 0) {
                bVar3 = local_78.first_.has_value_ == local_78.last_.has_value_;
              }
              uVar5 = extraout_RDX_02;
            } while (!bVar3);
          }
          goto LAB_0044188e;
        }
        _Var7._M_current = _Var7._M_current + 1;
        bVar9 = _Var7._M_current == local_58;
        if ((bVar6 & 1) == 0) {
          bVar9 = bVar1 == bVar2;
        }
      } while (bVar9 == false);
    }
    local_90.long_str_.ptr_ = (pointer)operator_new(0x20);
    *(undefined8 *)
     &(((pointer)local_90.long_str_.ptr_)->
      super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 = 0;
    ((pointer)local_90.long_str_.ptr_)->p_ = (pointer)0x0;
    (local_90.byte_str_.ptr_)->length_ = 0;
    local_90.common_ = (common_storage)0xe;
    n_00 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(value);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_90.common_
               ,n_00);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_78,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value);
    bVar3 = local_78.first_.has_value_ == local_78.last_.has_value_;
    if ((local_78.first_.has_value_ & local_78.last_.has_value_ & 1U) != 0) {
      bVar3 = local_78.first_.it_._M_current == local_78.last_.it_._M_current;
    }
    if (!bVar3) {
      args = &(local_78.first_.it_._M_current)->value_;
      do {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                   &local_90.common_,args);
        bVar3 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(args + 1) == local_78.last_.it_._M_current;
        if ((local_78.first_.has_value_ & local_78.last_.has_value_ & 1U) == 0) {
          bVar3 = local_78.first_.has_value_ == local_78.last_.has_value_;
        }
        args = args + 3;
      } while (!bVar3);
    }
    pvVar4 = operator_new(0x20);
    *(undefined8 *)((long)pvVar4 + 8) = 0;
    *(undefined8 *)((long)pvVar4 + 0x10) = 0;
    *(undefined8 *)((long)pvVar4 + 0x18) = 0;
    *(undefined2 *)this = 0xe;
    *(void **)(this + 8) = pvVar4;
    aVar11 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        &local_90.common_);
    value_00 = aVar11.first_._M_current;
    if (value_00._M_current != aVar11.last_._M_current._M_current) {
      do {
        safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((jsonpointer *)&local_78,value_00._M_current);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_78);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_78);
        value_00._M_current = value_00._M_current + 1;
      } while (value_00._M_current != aVar11.last_._M_current._M_current);
    }
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_90.common_
              );
    uVar5 = extraout_RDX_00;
  }
LAB_0044188e:
  bVar12.field_0.int64_.val_ = uVar5;
  bVar12.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar12.field_0;
}

Assistant:

Json safe_unflatten (Json& value)
    {
        if (!value.is_object() || value.empty())
        {
            return value;
        }
        bool safe = true;
        std::size_t index = 0;
        for (const auto& item : value.object_range())
        {
            std::size_t n;
            auto r = jsoncons::detail::dec_to_integer(item.key().data(),item.key().size(), n);
            if (!r || (index++ != n))
            {
                safe = false;
                break;
            }
        }

        if (safe)
        {
            Json j(json_array_arg);
            j.reserve(value.size());
            for (auto& item : value.object_range())
            {
                j.emplace_back(std::move(item.value()));
            }
            Json a(json_array_arg);
            for (auto& item : j.array_range())
            {
                a.emplace_back(safe_unflatten (item));
            }
            return a;
        }
        else
        {
            Json o(json_object_arg);
            for (auto& item : value.object_range())
            {
                o.try_emplace(item.key(), safe_unflatten (item.value()));
            }
            return o;
        }
    }